

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# marray.hxx
# Opt level: O0

value_type __thiscall
andres::
BinaryViewExpression<andres::View<float,true,std::allocator<unsigned_long>>,float,andres::View<float,true,std::allocator<unsigned_long>>,float,andres::marray_detail::Plus<float,float,float>>
::operator()(BinaryViewExpression<andres::View<float,true,std::allocator<unsigned_long>>,float,andres::View<float,true,std::allocator<unsigned_long>>,float,andres::marray_detail::Plus<float,float,float>>
             *this,int it)

{
  reference x;
  reference y;
  float fVar1;
  int it_local;
  BinaryViewExpression<andres::View<float,_true,_std::allocator<unsigned_long>_>,_float,_andres::View<float,_true,_std::allocator<unsigned_long>_>,_float,_andres::marray_detail::Plus<float,_float,_float>_>
  *this_local;
  
  x = View<float,true,std::allocator<unsigned_long>>::operator()
                (*(View<float,true,std::allocator<unsigned_long>> **)this,it);
  y = View<float,true,std::allocator<unsigned_long>>::operator()
                (*(View<float,true,std::allocator<unsigned_long>> **)(this + 8),it);
  fVar1 = marray_detail::Plus<float,_float,_float>::operator()
                    ((Plus<float,_float,_float> *)(this + 0x10),x,y);
  return fVar1;
}

Assistant:

const value_type operator()(Accessor it) const
            { return binaryFunctor_(e1_(it), e2_(it)); }